

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# err.cc
# Opt level: O2

void ERR_SAVE_STATE_free(ERR_SAVE_STATE *state)

{
  long lVar1;
  size_t i;
  ulong uVar2;
  
  if (state != (ERR_SAVE_STATE *)0x0) {
    lVar1 = 0;
    for (uVar2 = 0; uVar2 < state->num_errors; uVar2 = uVar2 + 1) {
      err_clear((err_error_st *)((long)&state->errors->file + lVar1));
      lVar1 = lVar1 + 0x18;
    }
    free(state->errors);
    free(state);
    return;
  }
  return;
}

Assistant:

void ERR_SAVE_STATE_free(ERR_SAVE_STATE *state) {
  if (state == NULL) {
    return;
  }
  for (size_t i = 0; i < state->num_errors; i++) {
    err_clear(&state->errors[i]);
  }
  free(state->errors);
  free(state);
}